

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O1

void __thiscall
QHeaderViewPrivate::resizeSections
          (QHeaderViewPrivate *this,ResizeMode globalMode,bool useGlobalMode)

{
  HeaderMode HVar1;
  QObject *this_00;
  QWidgetData *pQVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ResizeMode RVar8;
  iterator iVar9;
  ResizeMode RVar10;
  int iVar11;
  uint uVar12;
  int logical;
  ulong uVar13;
  ulong uVar14;
  ResizeMode RVar15;
  ulong uVar16;
  long in_FS_OFFSET;
  bool bVar17;
  int local_c0;
  uint local_b4;
  ulong local_b0;
  QArrayDataPointer<int> local_88;
  uint local_64;
  uint local_60;
  int local_5c;
  void *local_58;
  int *piStack_50;
  uint *local_48;
  uint *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QObject **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  QBasicTimer::stop();
  if (((this->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
     ((this->super_QAbstractItemViewPrivate).state != CollapsingState)) {
    QAbstractItemViewPrivate::interruptDelayedItemsLayout(&this->super_QAbstractItemViewPrivate);
    (**(code **)(**(long **)&(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate
                             .super_QFramePrivate.super_QWidgetPrivate.field_0x8 + 0x220))();
  }
  if ((this->headerMode == InitialNoSectionMemoryUsage) &&
     ((((this->stretchSections != 0 || (this->stretchLastSection != false)) ||
       (this->contentsSections != 0)) || ((useGlobalMode && (this->globalResizeMode != Custom))))))
  {
    setHeaderMode(this,FlexibleWithSectionMemoryUsage);
  }
  if (this->headerMode == InitialNoSectionMemoryUsage) {
    iVar11 = (int)this->countInNoSectionItemsMode;
  }
  else {
    iVar11 = (int)(this->sectionItems).d.size;
  }
  if ((iVar11 != 0) && (this->resizeRecursionBlock == false)) {
    this->resizeRecursionBlock = true;
    (this->cachedSizeHint).wd = -1;
    (this->cachedSizeHint).ht = -1;
    uVar4 = QHeaderView::visualIndex((QHeaderView *)this_00,this->lastSectionLogicalIdx);
    uVar12 = uVar4;
    if (useGlobalMode) {
      uVar12 = 0xffffffff;
    }
    uVar13 = (ulong)uVar12;
    if (this->stretchLastSection == false) {
      uVar13 = 0xffffffff;
    }
    bVar17 = this->orientation != Horizontal;
    pQVar2 = ((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    local_b0._0_4_ = ((&(pQVar2->crect).x2)[bVar17].m_i - (&(pQVar2->crect).x1)[bVar17].m_i) + 1;
    local_88.d = (Data *)0x0;
    local_88.ptr = (int *)0x0;
    local_88.size = 0;
    uVar16 = 0;
    uVar12 = 0;
    while( true ) {
      HVar1 = this->headerMode;
      if (HVar1 == InitialNoSectionMemoryUsage) {
        iVar11 = (int)this->countInNoSectionItemsMode;
      }
      else {
        iVar11 = (int)(this->sectionItems).d.size;
      }
      if ((long)iVar11 <= (long)uVar16) break;
      if ((HVar1 == InitialNoSectionMemoryUsage) ||
         (((this->sectionItems).d.ptr[uVar16].field_0x2 & 0x10) == 0)) {
        RVar10 = globalMode;
        if (uVar13 == uVar16) {
          RVar10 = Stretch;
        }
        if ((!useGlobalMode) && (RVar10 = Stretch, uVar13 != uVar16)) {
          if (uVar16 < (ulong)(this->sectionItems).d.size) {
            RVar10 = *(uint *)((this->sectionItems).d.ptr + uVar16) >> 0x15 & 0x1f;
          }
          else {
            RVar10 = this->globalResizeMode;
          }
        }
        if (RVar10 == Stretch) {
          if (HVar1 == InitialNoSectionMemoryUsage) {
            uVar5 = this->defaultSectionSize;
          }
          else {
            uVar5 = 0xffffffff;
            if ((long)uVar16 < (long)(int)(this->sectionItems).d.size) {
              uVar5 = *(uint *)((this->sectionItems).d.ptr + uVar16) & 0xfffff;
            }
          }
          uVar12 = uVar12 + 1;
          local_58 = (void *)CONCAT44(local_58._4_4_,uVar5);
          QtPrivate::QPodArrayOps<int>::emplace<int&>
                    ((QPodArrayOps<int> *)&local_88,local_88.size,(int *)&local_58);
          QList<int>::end((QList<int> *)&local_88);
        }
        else {
          if ((RVar10 & ~Custom) == Interactive) {
            uVar5 = QHeaderView::minimumSectionSize((QHeaderView *)this_00);
            if (this->headerMode == InitialNoSectionMemoryUsage) {
              uVar7 = this->defaultSectionSize;
            }
            else {
              uVar7 = 0xffffffff;
              if ((long)uVar16 < (long)(int)(this->sectionItems).d.size) {
                uVar7 = *(uint *)((this->sectionItems).d.ptr + uVar16) & 0xfffff;
              }
            }
            uVar6 = *(uint *)(*(long *)(this_00 + 8) + 0x608);
            if (uVar6 == 0xffffffff) {
              uVar6 = 0xfffff;
            }
            if ((int)uVar7 <= (int)uVar6) {
              uVar6 = uVar7;
            }
            if ((int)uVar6 < (int)uVar5) {
              uVar6 = uVar5;
            }
          }
          else {
            lVar3 = *(long *)(this_00 + 8);
            if (*(int *)(lVar3 + 0x650) == 0) {
              iVar11 = (int)*(undefined8 *)(lVar3 + 0x658);
            }
            else {
              iVar11 = (int)*(undefined8 *)(lVar3 + 0x648);
            }
            logical = -1;
            if ((long)uVar16 < (long)iVar11) {
              logical = (int)uVar16;
            }
            if (((*(int *)(lVar3 + 0x650) != 0) && ((long)uVar16 < (long)iVar11)) &&
               (logical = (int)uVar16, *(long *)(lVar3 + 0x580) != 0)) {
              logical = *(int *)(*(long *)(lVar3 + 0x578) + uVar16 * 4);
            }
            uVar5 = viewSectionSizeHint(this,logical);
            uVar6 = QHeaderView::sectionSizeHint((QHeaderView *)this_00,logical);
            if ((int)uVar6 < (int)uVar5) {
              uVar6 = uVar5;
            }
          }
          uVar7 = QHeaderView::minimumSectionSize((QHeaderView *)this_00);
          uVar5 = *(uint *)(*(long *)(this_00 + 8) + 0x608);
          if (uVar5 == 0xffffffff) {
            uVar5 = 0xfffff;
          }
          if ((int)uVar6 <= (int)uVar5) {
            uVar5 = uVar6;
          }
          if ((int)uVar7 <= (int)uVar5) {
            uVar7 = uVar5;
          }
          local_58 = (void *)CONCAT44(local_58._4_4_,uVar7);
          QtPrivate::QPodArrayOps<int>::emplace<int&>
                    ((QPodArrayOps<int> *)&local_88,local_88.size,(int *)&local_58);
          QList<int>::end((QList<int> *)&local_88);
          local_b0._0_4_ = (uint)local_b0 - uVar7;
        }
      }
      uVar16 = uVar16 + 1;
    }
    local_b4 = 0xffffffff;
    if ((int)uVar12 < 1) {
      uVar16 = 0;
    }
    else {
      uVar16 = 0;
      if (0 < (int)(uint)local_b0) {
        local_b4 = QHeaderView::minimumSectionSize((QHeaderView *)this_00);
        uVar16 = (ulong)(uint)local_b0 % (ulong)uVar12;
        if ((int)local_b4 < (int)((uint)local_b0 / uVar12)) {
          local_b4 = (uint)local_b0 / uVar12;
        }
      }
    }
    uVar14 = 0;
    local_c0 = 0;
    uVar12 = 0;
    RVar10 = Interactive;
    local_b0 = uVar16;
    while( true ) {
      HVar1 = this->headerMode;
      if (HVar1 == InitialNoSectionMemoryUsage) {
        iVar11 = (int)this->countInNoSectionItemsMode;
      }
      else {
        iVar11 = (int)(this->sectionItems).d.size;
      }
      if ((long)iVar11 <= (long)uVar14) break;
      if (HVar1 == InitialNoSectionMemoryUsage) {
        uVar5 = this->defaultSectionSize;
      }
      else {
        uVar5 = 0xffffffff;
        if ((long)uVar14 < (long)(int)(this->sectionItems).d.size) {
          uVar5 = *(uint *)((this->sectionItems).d.ptr + uVar14) & 0xfffff;
        }
      }
      if (uVar14 < (ulong)(this->sectionItems).d.size) {
        RVar15 = *(uint *)((this->sectionItems).d.ptr + uVar14) >> 0x15 & 0x1f;
      }
      else {
        RVar15 = this->globalResizeMode;
      }
      if ((HVar1 == InitialNoSectionMemoryUsage) ||
         (uVar7 = 0, ((this->sectionItems).d.ptr[uVar14].field_0x2 & 0x10) == 0)) {
        RVar8 = RVar15;
        if (uVar13 == uVar14) {
          RVar8 = Stretch;
        }
        if (useGlobalMode) {
          RVar8 = globalMode;
        }
        if ((RVar8 == Stretch) && (local_b4 != 0xffffffff)) {
          uVar7 = this->lastSectionSize;
          if (this->lastSectionSize < (int)local_b4) {
            uVar7 = local_b4;
          }
          if (uVar4 != uVar14) {
            uVar7 = local_b4;
          }
          iVar11 = (int)local_b0;
          uVar6 = iVar11 - 1;
          if (iVar11 < 1) {
            uVar6 = 0;
          }
          local_b0 = (ulong)uVar6;
          uVar7 = (0 < iVar11) + uVar7;
          if ((&(local_88.d)->super_QArrayData == (QArrayData *)0x0) ||
             (1 < ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
            QArrayDataPointer<int>::reallocateAndGrow
                      (&local_88,GrowsAtEnd,0,(QArrayDataPointer<int> *)0x0);
          }
        }
        else {
          iVar9 = QList<int>::begin((QList<int> *)&local_88);
          uVar7 = *iVar9.i;
        }
        local_88.ptr = local_88.ptr + 1;
        local_88.size = local_88.size + -1;
      }
      iVar11 = (int)uVar14;
      if (RVar10 == RVar15) {
        if (uVar12 != uVar7 && uVar14 != 0) {
LAB_00554b10:
          createSectionItems(this,local_c0,iVar11 + -1,uVar12,RVar10);
          local_c0 = iVar11;
        }
      }
      else if (uVar14 != 0) goto LAB_00554b10;
      if (uVar7 != uVar5) {
        if ((this->logicalIndices).d.size != 0) {
          iVar11 = (this->logicalIndices).d.ptr[uVar14];
        }
        local_58 = (void *)0x0;
        piStack_50 = &local_5c;
        local_48 = &local_60;
        puStack_40 = &local_64;
        local_64 = uVar7;
        local_60 = uVar5;
        local_5c = iVar11;
        QMetaObject::activate(this_00,&QHeaderView::staticMetaObject,1,&local_58);
      }
      uVar14 = uVar14 + 1;
      uVar12 = uVar7;
      RVar10 = RVar15;
    }
    if (HVar1 == InitialNoSectionMemoryUsage) {
      iVar11 = (int)this->countInNoSectionItemsMode;
    }
    else {
      iVar11 = (int)(this->sectionItems).d.size;
    }
    createSectionItems(this,local_c0,iVar11 + -1,uVar12,RVar10);
    this->resizeRecursionBlock = false;
    QWidget::update((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport
                   );
    if (&(local_88.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d)->super_QArrayData,4,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHeaderViewPrivate::resizeSections(QHeaderView::ResizeMode globalMode, bool useGlobalMode)
{
    Q_Q(QHeaderView);
    //stop the timer in case it is delayed
    delayedResize.stop();

    executePostedLayout();

    if (noSectionMemoryUsage() &&
       (hasAutoResizeSections() || (useGlobalMode && globalResizeMode != QHeaderView::Fixed))) {
        setHeaderMode(HeaderMode::FlexibleWithSectionMemoryUsage);
    }

    if (sectionCount() == 0 )
        return;

    if (resizeRecursionBlock)
        return;
    resizeRecursionBlock = true;

    invalidateCachedSizeHint();
    const int lastSectionVisualIdx = q->visualIndex(lastSectionLogicalIdx);

    // find stretchLastSection if we have it
    int stretchSection = -1;
    if (stretchLastSection && !useGlobalMode)
        stretchSection = lastSectionVisualIdx;

    // count up the number of stretched sections and how much space left for them
    int lengthToStretch = (orientation == Qt::Horizontal ? viewport->width() : viewport->height());
    int numberOfStretchedSections = 0;
    QList<int> section_sizes;
    for (int i = 0; i < sectionCount(); ++i) {
        if (isVisualIndexHidden(i))
            continue;

        QHeaderView::ResizeMode resizeMode;
        if (useGlobalMode && (i != stretchSection))
            resizeMode = globalMode;
        else
            resizeMode = (i == stretchSection ? QHeaderView::Stretch : headerSectionResizeMode(i));

        if (resizeMode == QHeaderView::Stretch) {
            ++numberOfStretchedSections;
            section_sizes.append(headerSectionSize(i));
            continue;
        }

        // because it isn't stretch, determine its width and remove that from lengthToStretch
        int sectionSize = 0;
        if (resizeMode == QHeaderView::Interactive || resizeMode == QHeaderView::Fixed) {
            sectionSize = qBound(q->minimumSectionSize(), headerSectionSize(i), q->maximumSectionSize());
        } else { // resizeMode == QHeaderView::ResizeToContents
            int logicalIndex = q->logicalIndex(i);
            sectionSize = qMax(viewSectionSizeHint(logicalIndex),
                               q->sectionSizeHint(logicalIndex));
        }
        sectionSize = qBound(q->minimumSectionSize(),
                             sectionSize,
                             q->maximumSectionSize());

        section_sizes.append(sectionSize);
        lengthToStretch -= sectionSize;
    }

    // calculate the new length for all of the stretched sections
    int stretchSectionLength = -1;
    int pixelReminder = 0;
    if (numberOfStretchedSections > 0 && lengthToStretch > 0) { // we have room to stretch in
        int hintLengthForEveryStretchedSection = lengthToStretch / numberOfStretchedSections;
        stretchSectionLength = qMax(hintLengthForEveryStretchedSection, q->minimumSectionSize());
        pixelReminder = lengthToStretch % numberOfStretchedSections;
    }

    // ### The code below would be nicer if it was cleaned up a bit (since spans has been replaced with items)
    int spanStartSection = 0;
    int previousSectionLength = 0;

    QHeaderView::ResizeMode previousSectionResizeMode = QHeaderView::Interactive;

    // resize each section along the total length
    for (int i = 0; i < sectionCount(); ++i) {
        int oldSectionLength = headerSectionSize(i);
        int newSectionLength = -1;
        QHeaderView::ResizeMode newSectionResizeMode = headerSectionResizeMode(i);

        if (isVisualIndexHidden(i)) {
            newSectionLength = 0;
        } else {
            QHeaderView::ResizeMode resizeMode;
            if (useGlobalMode)
                resizeMode = globalMode;
            else
                resizeMode = (i == stretchSection
                              ? QHeaderView::Stretch
                              : newSectionResizeMode);
            if (resizeMode == QHeaderView::Stretch && stretchSectionLength != -1) {
                if (i == lastSectionVisualIdx)
                    newSectionLength = qMax(stretchSectionLength, lastSectionSize);
                else
                    newSectionLength = stretchSectionLength;
                if (pixelReminder > 0) {
                    newSectionLength += 1;
                    --pixelReminder;
                }
                section_sizes.removeFirst();
            } else {
                newSectionLength = section_sizes.takeFirst();
            }
        }

        //Q_ASSERT(newSectionLength > 0);
        if ((previousSectionResizeMode != newSectionResizeMode
            || previousSectionLength != newSectionLength) && i > 0) {
            createSectionItems(spanStartSection, i - 1, previousSectionLength, previousSectionResizeMode);
            //Q_ASSERT(headerLength() == length);
            spanStartSection = i;
        }

        if (newSectionLength != oldSectionLength)
            emit q->sectionResized(logicalIndex(i), oldSectionLength, newSectionLength);

        previousSectionLength = newSectionLength;
        previousSectionResizeMode = newSectionResizeMode;
    }

    createSectionItems(spanStartSection, sectionCount() - 1,
                       previousSectionLength, previousSectionResizeMode);
    //Q_ASSERT(headerLength() == length);
    resizeRecursionBlock = false;
    viewport->update();
}